

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall
CBlockPolicyEstimator::processTransaction(CBlockPolicyEstimator *this,NewMempoolTransactionInfo *tx)

{
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  *this_00;
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  Txid *pTVar8;
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  *category;
  Txid *this_01;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  CFeeRate feeRate;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock1,&this->m_cs_fee_estimator,"m_cs_fee_estimator",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
             ,0x252,false);
  uVar5 = (tx->info).txHeight;
  this_01 = &((tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->hash;
  this_00 = &this->mapMemPoolTxs;
  pTVar8 = this_01;
  category = this_00;
  sVar6 = std::
          map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
          ::count(this_00,&this_01->m_wrapped);
  if (sVar6 == 0) {
    if (uVar5 == this->nBestSeenHeight) {
      if ((((tx->m_mempool_limit_bypassed == false) && (tx->m_submitted_in_package == false)) &&
          (tx->m_chainstate_is_current == true)) && (tx->m_has_no_mempool_parents != false)) {
        this->trackedTxs = this->trackedTxs + 1;
        CFeeRate::CFeeRate(&feeRate,&(tx->info).m_fee,
                           (uint32_t)(tx->info).m_virtual_transaction_size);
        pmVar7 = std::
                 map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                 ::operator[](this_00,&this_01->m_wrapped);
        pmVar7->blockHeight = uVar5;
        uVar3 = TxConfirmStats::NewTx
                          ((this->feeStats)._M_t.
                           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                           .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,uVar5,
                           (double)feeRate.nSatoshisPerK);
        pmVar7 = std::
                 map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                 ::operator[](this_00,&this_01->m_wrapped);
        pmVar7->bucketIndex = uVar3;
        uVar4 = TxConfirmStats::NewTx
                          ((this->shortStats)._M_t.
                           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                           .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,uVar5,
                           (double)feeRate.nSatoshisPerK);
        if (uVar3 != uVar4) {
          __assert_fail("bucketIndex == bucketIndex2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                        ,0x278,
                        "void CBlockPolicyEstimator::processTransaction(const NewMempoolTransactionInfo &)"
                       );
        }
        uVar5 = TxConfirmStats::NewTx
                          ((this->longStats)._M_t.
                           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                           .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,uVar5,
                           (double)feeRate.nSatoshisPerK);
        if (uVar3 != uVar5) {
          __assert_fail("bucketIndex == bucketIndex3",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                        ,0x27a,
                        "void CBlockPolicyEstimator::processTransaction(const NewMempoolTransactionInfo &)"
                       );
        }
      }
      else {
        this->untrackedTxs = this->untrackedTxs + 1;
      }
    }
  }
  else {
    bVar2 = ::LogAcceptCategory((LogFlags)category,(Level)pTVar8);
    if (bVar2) {
      base_blob<256u>::ToString_abi_cxx11_((string *)&feeRate,(base_blob<256u> *)this_01);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x5f;
      logging_function._M_str = "processTransaction";
      logging_function._M_len = 0x12;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,599,ESTIMATEFEE,Debug,
                 (ConstevalFormatString<1U>)0xcb7852,(string *)&feeRate);
      std::__cxx11::string::~string((string *)&feeRate);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockPolicyEstimator::processTransaction(const NewMempoolTransactionInfo& tx)
{
    LOCK(m_cs_fee_estimator);
    const unsigned int txHeight = tx.info.txHeight;
    const auto& hash = tx.info.m_tx->GetHash();
    if (mapMemPoolTxs.count(hash)) {
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error mempool tx %s already being tracked\n",
                 hash.ToString());
        return;
    }

    if (txHeight != nBestSeenHeight) {
        // Ignore side chains and re-orgs; assuming they are random they don't
        // affect the estimate.  We'll potentially double count transactions in 1-block reorgs.
        // Ignore txs if BlockPolicyEstimator is not in sync with ActiveChain().Tip().
        // It will be synced next time a block is processed.
        return;
    }
    // This transaction should only count for fee estimation if:
    // - it's not being re-added during a reorg which bypasses typical mempool fee limits
    // - the node is not behind
    // - the transaction is not dependent on any other transactions in the mempool
    // - it's not part of a package.
    const bool validForFeeEstimation = !tx.m_mempool_limit_bypassed && !tx.m_submitted_in_package && tx.m_chainstate_is_current && tx.m_has_no_mempool_parents;

    // Only want to be updating estimates when our blockchain is synced,
    // otherwise we'll miscalculate how many blocks its taking to get included.
    if (!validForFeeEstimation) {
        untrackedTxs++;
        return;
    }
    trackedTxs++;

    // Feerates are stored and reported as BTC-per-kb:
    const CFeeRate feeRate(tx.info.m_fee, tx.info.m_virtual_transaction_size);

    mapMemPoolTxs[hash].blockHeight = txHeight;
    unsigned int bucketIndex = feeStats->NewTx(txHeight, static_cast<double>(feeRate.GetFeePerK()));
    mapMemPoolTxs[hash].bucketIndex = bucketIndex;
    unsigned int bucketIndex2 = shortStats->NewTx(txHeight, static_cast<double>(feeRate.GetFeePerK()));
    assert(bucketIndex == bucketIndex2);
    unsigned int bucketIndex3 = longStats->NewTx(txHeight, static_cast<double>(feeRate.GetFeePerK()));
    assert(bucketIndex == bucketIndex3);
}